

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

ssize_t __thiscall
Json::BuiltStyledStreamWriter::write(BuiltStyledStreamWriter *this,int __fd,void *__buf,size_t __n)

{
  Value *in_stack_00000048;
  BuiltStyledStreamWriter *in_stack_00000050;
  Value *in_stack_00000068;
  BuiltStyledStreamWriter *in_stack_00000070;
  Value *in_stack_00000208;
  BuiltStyledStreamWriter *in_stack_00000210;
  
  (this->super_StreamWriter).sout_ = (ostream *)__buf;
  this->field_0xd8 = this->field_0xd8 & 0xfe;
  this->field_0xd8 = this->field_0xd8 & 0xfd | 2;
  std::__cxx11::string::operator=((string *)&this->indentString_,"");
  writeCommentBeforeValue(in_stack_00000050,in_stack_00000048);
  if (((byte)this->field_0xd8 >> 1 & 1) == 0) {
    writeIndent(this);
  }
  this->field_0xd8 = this->field_0xd8 & 0xfd | 2;
  writeValue(in_stack_00000210,in_stack_00000208);
  writeCommentAfterValueOnSameLine(in_stack_00000070,in_stack_00000068);
  std::operator<<((this->super_StreamWriter).sout_,(string *)&this->endingLineFeedSymbol_);
  (this->super_StreamWriter).sout_ = (ostream *)0x0;
  return 0;
}

Assistant:

int BuiltStyledStreamWriter::write(Value const& root, std::ostream* sout)
{
  sout_ = sout;
  addChildValues_ = false;
  indented_ = true;
  indentString_ = "";
  writeCommentBeforeValue(root);
  if (!indented_) writeIndent();
  indented_ = true;
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  *sout_ << endingLineFeedSymbol_;
  sout_ = NULL;
  return 0;
}